

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O2

void __thiscall
Fl_Input_::handle_mouse(Fl_Input_ *this,int X,int Y,int param_3,int param_4,int drag)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  int iVar11;
  double dVar12;
  double local_440;
  char buf [1024];
  
  was_up_down = 0;
  if (this->size_ == 0) {
    was_up_down = 0;
    return;
  }
  setfont(this);
  uVar7 = 0;
  if (((this->super_Fl_Widget).type_ & 7) == 4) {
    iVar11 = Fl::e_y - Y;
    iVar5 = this->yscroll_;
    iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
    uVar7 = (long)(iVar11 + iVar5) / (long)iVar3 & 0xffffffff;
  }
  pcVar8 = this->value_;
  while( true ) {
    pcVar6 = expand(this,pcVar8,buf);
    if (((int)uVar7 < 1) || (this->value_ + this->size_ <= pcVar6)) break;
    pcVar8 = pcVar6 + 1;
    uVar7 = (ulong)((int)uVar7 - 1);
  }
  local_440 = (double)((Fl::e_x - X) + this->xscroll_);
  pcVar9 = pcVar8;
  pcVar2 = pcVar6;
  while (pcVar10 = pcVar2, pcVar9 < pcVar10) {
    uVar4 = fl_utf8len(*pcVar9);
    uVar7 = (ulong)uVar4;
    if ((int)uVar4 < 2) {
      uVar7 = 1;
    }
    iVar5 = this->xscroll_;
    dVar12 = expandpos(this,pcVar8,pcVar9 + uVar7,buf,(int *)0x0);
    dVar12 = dVar12 + (double)(X - iVar5);
    pcVar2 = pcVar9;
    if (dVar12 <= (double)Fl::e_x) {
      local_440 = (double)Fl::e_x - dVar12;
      pcVar9 = pcVar9 + uVar7;
      pcVar2 = pcVar10;
    }
  }
  if ((pcVar9 < pcVar6) && (uVar4 = fl_utf8len(*pcVar9), 0 < (int)uVar4)) {
    iVar5 = this->xscroll_;
    dVar12 = expandpos(this,pcVar8,pcVar9 + uVar4,buf,(int *)0x0);
    if ((dVar12 + (double)(X - iVar5)) - (double)Fl::e_x < local_440) {
      pcVar9 = pcVar9 + uVar4;
    }
  }
  pcVar8 = this->value_;
  iVar3 = (int)pcVar9 - (int)pcVar8;
  iVar5 = iVar3;
  if (drag != 0) {
    iVar5 = this->mark_;
  }
  if (Fl::e_clicks != 0) {
    if (iVar3 < iVar5) {
      if (Fl::e_clicks < 2) {
        uVar4 = (this->super_Fl_Widget).type_ & 7;
        iVar3 = strict_word_start(pcVar8,iVar3,uVar4);
        iVar5 = strict_word_end(pcVar8,this->size_,iVar5,uVar4);
      }
      else {
        iVar3 = line_start(this,iVar3);
        iVar5 = line_end(this,iVar5);
      }
    }
    else {
      if (iVar5 == iVar3) {
        if (iVar3 < this->size_) {
          iVar5 = iVar3;
          iVar3 = iVar3 + 1;
        }
        else {
          iVar5 = iVar3 + -1;
        }
      }
      if (Fl::e_clicks < 2) {
        uVar4 = (this->super_Fl_Widget).type_ & 7;
        iVar3 = strict_word_end(pcVar8,this->size_,iVar3,uVar4);
        iVar5 = strict_word_start(pcVar8,iVar5,uVar4);
      }
      else {
        iVar3 = line_end(this,iVar3);
        iVar5 = line_start(this,iVar5);
      }
    }
    if (drag == 0) {
      iVar11 = this->position_;
      iVar1 = this->mark_;
      if (iVar11 < iVar1) {
        if ((iVar1 < iVar3) || (iVar5 < iVar11)) goto LAB_001b9600;
      }
      else if ((iVar5 < iVar1) || (iVar11 < iVar3)) goto LAB_001b9600;
      Fl::e_clicks = 0;
      iVar3 = (int)pcVar9 - *(int *)&this->value_;
      iVar5 = iVar3;
    }
  }
LAB_001b9600:
  position(this,iVar3,iVar5);
  return;
}

Assistant:

void Fl_Input_::handle_mouse(int X, int Y, int /*W*/, int /*H*/, int drag) {
  was_up_down = 0;
  if (!size()) return;
  setfont();

  const char *p, *e;
  char buf[MAXBUF];

  int theline = (input_type()==FL_MULTILINE_INPUT) ?
    (Fl::event_y()-Y+yscroll_)/fl_height() : 0;

  int newpos = 0;
  for (p=value();; ) {
    e = expand(p, buf);
    theline--; if (theline < 0) break;
    if (e >= value_+size_) break;
    p = e+1;
  }
  const char *l, *r, *t; double f0 = Fl::event_x()-X+xscroll_;
  for (l = p, r = e; l<r; ) {
    double f;
    int cw = fl_utf8len((char)l[0]);
    if (cw < 1) cw = 1;
    t = l+cw;
    f = X-xscroll_+expandpos(p, t, buf, 0);
    if (f <= Fl::event_x()) {l = t; f0 = Fl::event_x()-f;}
    else r = t-cw;
  }
  if (l < e) { // see if closer to character on right:
    double f1;
    int cw = fl_utf8len((char)l[0]);
    if (cw > 0) {
      f1 = X-xscroll_+expandpos(p, l + cw, buf, 0) - Fl::event_x();
      if (f1 < f0) l = l+cw;
    }
  }
  newpos = (int) (l-value());

  int newmark = drag ? mark() : newpos;
  if (Fl::event_clicks()) {
    if (newpos >= newmark) {
      if (newpos == newmark) {
	if (newpos < size()) newpos++;
	else newmark--;
      }
      if (Fl::event_clicks() > 1) {
	newpos = line_end(newpos);
	newmark = line_start(newmark);
      } else {
	newpos = strict_word_end(value(), size(), newpos, input_type());
	newmark = strict_word_start(value(), newmark, input_type());
      }
    } else {
      if (Fl::event_clicks() > 1) {
	newpos = line_start(newpos);
	newmark = line_end(newmark);
      } else {
	newpos = strict_word_start(value(), newpos, input_type());
	newmark = strict_word_end(value(), size(), newmark, input_type());
      }
    }
    // if the multiple click does not increase the selection, revert
    // to single-click behavior:
    if (!drag && (mark() > position() ?
                  (newmark >= position() && newpos <= mark()) :
                  (newmark >= mark() && newpos <= position()))) {
      Fl::event_clicks(0);
      newmark = newpos = (int) (l-value());
    }
  }
  position(newpos, newmark);
}